

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O0

void __thiscall
QDBusPlatformMenu::insertMenuItem
          (QDBusPlatformMenu *this,QPlatformMenuItem *menuItem,QPlatformMenuItem *before)

{
  bool bVar1;
  qsizetype qVar2;
  QDBusPlatformMenu *this_00;
  QPlatformMenu *pQVar3;
  QDBusPlatformMenuItem *in_RSI;
  QDBusPlatformMenu *in_RDI;
  long in_FS_OFFSET;
  int idx;
  QDBusPlatformMenuItem *beforeItem;
  QDBusPlatformMenuItem *item;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff40;
  QDBusPlatformMenu *this_01;
  QList<QDBusPlatformMenuItem_*> *in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff58 [16];
  QDBusPlatformMenu *menu;
  QDebug local_30 [2];
  QDBusPlatformMenuItem *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  menu = in_RDI;
  local_20 = in_RSI;
  qVar2 = QListSpecialMethodsBase<QDBusPlatformMenuItem*>::indexOf<QDBusPlatformMenuItem*>
                    ((QListSpecialMethodsBase<QDBusPlatformMenuItem_*> *)in_stack_ffffffffffffff40,
                     (QDBusPlatformMenuItem **)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0xb18724);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1f0b6c9::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff40,
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_1f0b6c9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb1877e);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff48,
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (char *)0xb18794);
    QMessageLogger::debug();
    QDBusPlatformMenuItem::dbusID(local_20);
    in_stack_ffffffffffffff48 =
         (QList<QDBusPlatformMenuItem_*> *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    QDBusPlatformMenuItem::text
              ((QDBusPlatformMenuItem *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QDebug::operator<<((QDebug *)in_RDI,(QString *)in_stack_ffffffffffffff48);
    QString::~QString((QString *)0xb187f2);
    QDebug::~QDebug(local_30);
    local_10 = 0;
  }
  if ((int)qVar2 < 0) {
    QList<QDBusPlatformMenuItem_*>::append
              ((QList<QDBusPlatformMenuItem_*> *)0xb18829,
               (parameter_type)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    QList<QDBusPlatformMenuItem_*>::insert
              (in_stack_ffffffffffffff48,(qsizetype)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff58._0_8_);
  }
  this_01 = (QDBusPlatformMenu *)&in_RDI->m_itemsByTag;
  this_00 = (QDBusPlatformMenu *)(**(code **)(*(long *)local_20 + 0x68))();
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::insert
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)this_01,
             (unsigned_long_long *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (QDBusPlatformMenuItem **)0xb18883);
  pQVar3 = QDBusPlatformMenuItem::menu(local_20);
  if (pQVar3 != (QPlatformMenu *)0x0) {
    QDBusPlatformMenuItem::menu(local_20);
    syncSubMenu(this_00,menu);
  }
  emitUpdated(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::insertMenuItem(QPlatformMenuItem *menuItem, QPlatformMenuItem *before)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    QDBusPlatformMenuItem *beforeItem = static_cast<QDBusPlatformMenuItem *>(before);
    int idx = m_items.indexOf(beforeItem);
    qCDebug(qLcMenu) << item->dbusID() << item->text();
    if (idx < 0)
        m_items.append(item);
    else
        m_items.insert(idx, item);
    m_itemsByTag.insert(item->tag(), item);
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    emitUpdated();
}